

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtest.cc
# Opt level: O0

void test_norm_infinity(GlobalArray *g_a)

{
  int iVar1;
  char *message;
  int dims [7];
  int ndim;
  int type;
  int me;
  double result;
  double norm_infinity;
  DoubleComplex dcval;
  long lval;
  float fval;
  double dval;
  int ival;
  void *val;
  double *in_stack_ffffffffffffff48;
  GAServices *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  float fVar2;
  GlobalArray *in_stack_ffffffffffffff60;
  GAServices *pGVar3;
  int local_94;
  undefined4 local_58;
  GAServices *local_50;
  GAServices *local_40;
  double local_38;
  GAServices *local_30;
  float local_24;
  GAServices *local_20;
  int local_14;
  GAServices **local_10;
  
  local_14 = -2;
  local_20 = (GAServices *)0xc000000000000000;
  local_24 = -2.0;
  local_30 = (GAServices *)0xfffffffffffffffe;
  local_50 = (GAServices *)0xbff0000000000000;
  iVar1 = GA_Nodeid();
  GA::GlobalArray::inquire
            (in_stack_ffffffffffffff60,
             (int *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
             (int *)in_stack_ffffffffffffff50,(int *)in_stack_ffffffffffffff48);
  local_40 = (GAServices *)0xc000000000000000;
  local_38 = -0.0;
  switch(local_58) {
  case 0x3e9:
    local_10 = (GAServices **)&local_14;
    break;
  case 0x3ea:
    local_10 = &local_30;
    break;
  case 0x3eb:
    local_10 = (GAServices **)&local_24;
    break;
  case 0x3ec:
    local_10 = &local_20;
    break;
  default:
    GA::GAServices::error(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48,0);
    break;
  case 0x3ef:
    local_10 = &local_40;
  }
  if (iVar1 == 0) {
    printf("Testing GA_Norm_infinity...");
  }
  GA::GlobalArray::fill((GlobalArray *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  GA::GlobalArray::normInfinity((GlobalArray *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  switch(local_58) {
  case 0x3e9:
    if (local_14 < 0) {
      local_94 = -local_14;
    }
    else {
      local_94 = local_14;
    }
    local_50 = (GAServices *)(double)local_94;
    break;
  case 0x3ea:
    pGVar3 = local_30;
    if ((long)local_30 < 0) {
      pGVar3 = (GAServices *)-(long)local_30;
    }
    local_50 = (GAServices *)(double)(long)pGVar3;
    break;
  case 0x3eb:
    fVar2 = local_24;
    if (local_24 < 0.0) {
      fVar2 = -local_24;
    }
    local_50 = (GAServices *)(double)fVar2;
    break;
  case 0x3ec:
    in_stack_ffffffffffffff50 = local_20;
    local_50 = local_20;
    if ((double)local_20 < 0.0) {
      local_50 = (GAServices *)((ulong)local_20 ^ 0x8000000000000000);
      in_stack_ffffffffffffff50 = local_50;
    }
    break;
  default:
    GA::GAServices::error(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48,0);
    break;
  case 0x3ef:
    local_50 = (GAServices *)sqrt((double)local_40 * (double)local_40 + local_38 * local_38);
  }
  if (iVar1 == 0) {
    if ((double)local_50 - -1.0 < 0.0) {
      message = (char *)-((double)local_50 - -1.0);
    }
    else {
      message = (char *)((double)local_50 - -1.0);
    }
    if ((double)message < 1e-05) {
      printf("ok.\n");
    }
    else {
      printf("not ok.\n");
      GA::GAServices::error(in_stack_ffffffffffffff50,message,0);
    }
  }
  return;
}

Assistant:

void
test_norm_infinity (GA::GlobalArray * g_a) {

  void *val;
  int ival = -2;
  double dval = -2.0;
  float fval = -2.0;
  long lval = -2;
  DoubleComplex dcval;

  double norm_infinity = -1.0, result = -1.0;

  int me = GA_Nodeid ();
  int type, ndim, dims[MAXDIM];

  g_a->inquire (&type, &ndim, dims);
  dcval.real = -2.0;
  dcval.imag = -0.0;

  switch (type)
    {
    case C_INT:
      val = (void *)&ival;
      break;
    case C_DCPL:
      val = (void *)&dcval;
      break;
    case C_DBL:
      val = (void *)&dval;
      break;
    case C_FLOAT:
      val =(void *) &fval;
      break;
    case C_LONG:
      val = (void *)&lval;
      break;
    default:
      GA::SERVICES.error ((char *)"test_norm_infinity:wrong data type.", type);
    }

  if (me == 0)
    printf ("Testing GA_Norm_infinity...");
  g_a->fill (val);
  g_a->normInfinity (&norm_infinity);

  // GA_Print(g_a);
  //printf("norm_infinity = %lf\n",norm_infinity);
  switch (type)
    {
    case C_INT:
      result = (double) GA_ABS (ival);
      break;
    case C_LONG:
      result = (double) GA_ABS (lval);
      break;
    case C_FLOAT:
      result = (double) GA_ABS (fval);
      break;

    case C_DBL:
      result = GA_ABS (dval);
      break;

    case C_DCPL:
      result = sqrt (dcval.real * dcval.real + dcval.imag * dcval.imag);
      break;
    default:
      GA::SERVICES.error ((char *)"test_norm_infinity: wrong data type.\n", type);
    }
  if (me == 0)
    {
      if (MISMATCHED (result, norm_infinity)) {
          printf ("not ok.\n");
          GA::SERVICES.error ((char *)"test_norm_infinity:mismatched.", type);
      }
      else {
          printf ("ok.\n");
      }
    }
}